

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O2

void poll_cb(uv_poll_t *handle,int status,int events)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  size_t __n;
  int64_t eval_b;
  int64_t eval_a;
  char buffer [5];
  int fd;
  
  iVar1 = uv_fileno(handle,&fd);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a != 0) {
    pcVar8 = "0";
    pcVar7 = "uv_fileno((uv_handle_t*)handle, &fd)";
    uVar6 = 0x49;
    goto LAB_001673da;
  }
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  if ((events & 8U) != 0) {
    do {
      sVar4 = recv(client_fd,buffer,5,1);
      if ((int)sVar4 != -1) {
        if (-1 < (int)sVar4) goto LAB_00166d90;
        piVar5 = __errno_location();
        iVar1 = *piVar5;
        break;
      }
      piVar5 = __errno_location();
      iVar1 = *piVar5;
    } while (iVar1 == 4);
    if (iVar1 == 0x16) {
      pcVar7 = "n >= 0 || errno != EINVAL";
      uVar6 = 0x50;
      goto LAB_0016729f;
    }
LAB_00166d90:
    cli_pr_check = 1;
    iVar1 = uv_poll_stop(poll_req);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) {
      pcVar8 = "0";
      pcVar7 = "uv_poll_stop(&poll_req[0])";
      uVar6 = 0x52;
      goto LAB_001673da;
    }
    iVar1 = uv_poll_start(poll_req,3,poll_cb);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a != 0) {
      pcVar8 = "0";
      pcVar7 = "uv_poll_start(&poll_req[0], UV_READABLE | UV_WRITABLE, poll_cb)";
      uVar6 = 0x55;
      goto LAB_001673da;
    }
  }
  if ((events & 1U) != 0) {
    if (fd == client_fd) {
      do {
        sVar4 = recv(client_fd,buffer,5,0);
        iVar1 = (int)sVar4;
        if (iVar1 != -1) {
          if (-1 < iVar1) goto LAB_00166e5d;
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          break;
        }
        piVar5 = __errno_location();
        iVar2 = *piVar5;
      } while (iVar2 == 4);
      if (iVar2 == 0x16) {
        pcVar7 = "n >= 0 || errno != EINVAL";
        uVar6 = 0x5c;
        goto LAB_0016729f;
      }
LAB_00166e5d:
      if (cli_rd_check == 0) {
        eval_a = 4;
        eval_b = (int64_t)iVar1;
        if (eval_b != 4) {
          pcVar8 = "n";
          pcVar7 = "4";
          uVar6 = 99;
          goto LAB_001673da;
        }
        iVar1 = strncmp(buffer,"hello",4);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a != 0) {
          pcVar8 = "0";
          pcVar7 = "strncmp(buffer, \"hello\", n)";
          uVar6 = 100;
          goto LAB_001673da;
        }
        cli_rd_check = 1;
        do {
          while( true ) {
            sVar4 = recv(server_fd,buffer,5,0);
            uVar3 = (uint)sVar4;
            if (uVar3 == 0xffffffff) break;
            if ((int)uVar3 < 1) {
              piVar5 = __errno_location();
              iVar1 = *piVar5;
              goto LAB_00166fca;
            }
            eval_a = 5;
            eval_b = (int64_t)(uVar3 & 0x7fffffff);
            if (eval_b != 5) {
              pcVar8 = "n";
              pcVar7 = "5";
              uVar6 = 0x6b;
              goto LAB_001673da;
            }
            iVar1 = strncmp(buffer,"world",5);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a != 0) {
              pcVar8 = "0";
              pcVar7 = "strncmp(buffer, \"world\", n)";
              uVar6 = 0x6c;
              goto LAB_001673da;
            }
            cli_rd_check = 2;
          }
          piVar5 = __errno_location();
          iVar1 = *piVar5;
        } while (iVar1 == 4);
LAB_00166fca:
        if ((iVar1 != 0xb) && (iVar1 != 0x73)) {
          pcVar7 = "got_eagain()";
          uVar6 = 0x71;
          goto LAB_0016729f;
        }
      }
      else if (cli_rd_check == 1) {
        __n = (size_t)iVar1;
        iVar1 = strncmp(buffer,"world",__n);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a != 0) {
          pcVar8 = "0";
          pcVar7 = "strncmp(buffer, \"world\", n)";
          uVar6 = 0x5e;
          goto LAB_001673da;
        }
        eval_a = 5;
        if (__n != 5) {
          pcVar8 = "n";
          pcVar7 = "5";
          uVar6 = 0x5f;
          eval_b = __n;
          goto LAB_001673da;
        }
        cli_rd_check = 2;
      }
    }
    if (fd == server_fd) {
      do {
        sVar4 = recv(server_fd,buffer,3,0);
        iVar1 = (int)sVar4;
        if (iVar1 != -1) {
          if (-1 < iVar1) goto LAB_00167030;
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          break;
        }
        piVar5 = __errno_location();
        iVar2 = *piVar5;
      } while (iVar2 == 4);
      if (iVar2 == 0x16) {
        pcVar7 = "n >= 0 || errno != EINVAL";
        uVar6 = 0x78;
LAB_0016729f:
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                ,uVar6,pcVar7);
        abort();
      }
LAB_00167030:
      eval_a = 3;
      if ((long)iVar1 != 3) {
        pcVar8 = "n";
        pcVar7 = "3";
        uVar6 = 0x79;
        eval_b = (long)iVar1;
        goto LAB_001673da;
      }
      iVar1 = strncmp(buffer,"foo",3);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a != 0) {
        pcVar8 = "0";
        pcVar7 = "strncmp(buffer, \"foo\", n)";
        uVar6 = 0x7a;
        goto LAB_001673da;
      }
      srv_rd_check = 1;
      uv_poll_stop(0x309160);
    }
  }
  if ((events & 2U) != 0) {
    do {
      sVar4 = send(client_fd,"foo",3,0);
      iVar1 = (int)sVar4;
      if (-1 < iVar1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    eval_a = 3;
    if ((long)iVar1 != 3) {
      pcVar8 = "n";
      pcVar7 = "3";
      uVar6 = 0x83;
      eval_b = (long)iVar1;
LAB_001673da:
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
              ,uVar6,pcVar7,"==",pcVar8,eval_a,"==",eval_b);
      abort();
    }
  }
  return;
}

Assistant:

static void poll_cb(uv_poll_t* handle, int status, int events) {
  char buffer[5];
  int n;
  int fd;

  ASSERT_OK(uv_fileno((uv_handle_t*)handle, &fd));
  memset(buffer, 0, 5);

  if (events & UV_PRIORITIZED) {
    do
      n = recv(client_fd, &buffer, 5, MSG_OOB);
    while (n == -1 && errno == EINTR);
    ASSERT(n >= 0 || errno != EINVAL);
    cli_pr_check = 1;
    ASSERT_OK(uv_poll_stop(&poll_req[0]));
    ASSERT_OK(uv_poll_start(&poll_req[0],
                            UV_READABLE | UV_WRITABLE,
                            poll_cb));
  }
  if (events & UV_READABLE) {
    if (fd == client_fd) {
      do
        n = recv(client_fd, &buffer, 5, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      if (cli_rd_check == 1) {
        ASSERT_OK(strncmp(buffer, "world", n));
        ASSERT_EQ(5, n);
        cli_rd_check = 2;
      }
      if (cli_rd_check == 0) {
        ASSERT_EQ(4, n);
        ASSERT_OK(strncmp(buffer, "hello", n));
        cli_rd_check = 1;
        do {
          do
            n = recv(server_fd, &buffer, 5, 0);
          while (n == -1 && errno == EINTR);
          if (n > 0) {
            ASSERT_EQ(5, n);
            ASSERT_OK(strncmp(buffer, "world", n));
            cli_rd_check = 2;
          }
        } while (n > 0);

        ASSERT(got_eagain());
      }
    }
    if (fd == server_fd) {
      do
        n = recv(server_fd, &buffer, 3, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      ASSERT_EQ(3, n);
      ASSERT_OK(strncmp(buffer, "foo", n));
      srv_rd_check = 1;
      uv_poll_stop(&poll_req[1]);
    }
  }
  if (events & UV_WRITABLE) {
    do {
      n = send(client_fd, "foo", 3, 0);
    } while (n < 0 && errno == EINTR);
    ASSERT_EQ(3, n);
  }
}